

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::SequenceConcatExpr::Element>::
emplaceRealloc<slang::ast::SequenceConcatExpr::Element>
          (SmallVectorBase<slang::ast::SequenceConcatExpr::Element> *this,pointer pos,Element *args)

{
  SourceLocation *pSVar1;
  ulong uVar2;
  pointer p;
  undefined8 uVar3;
  undefined8 uVar4;
  SourceLocation SVar5;
  uint32_t uVar6;
  _Storage<unsigned_int,_true> _Var7;
  pointer pEVar8;
  long lVar9;
  pointer pEVar10;
  pointer pEVar11;
  long lVar12;
  size_type sVar13;
  ulong uVar14;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar14 = this->len + 1;
  uVar2 = this->cap;
  if (uVar14 < uVar2 * 2) {
    uVar14 = uVar2 * 2;
  }
  if (0x333333333333333 - uVar2 < uVar2) {
    uVar14 = 0x333333333333333;
  }
  lVar12 = (long)pos - (long)this->data_;
  pEVar8 = (pointer)operator_new(uVar14 * 0x28);
  *(AssertionExpr **)((long)pEVar8 + lVar12 + 0x20) = (args->sequence).ptr;
  uVar3 = *(undefined8 *)&args->delay;
  uVar4 = *(undefined8 *)
           &(args->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged;
  SVar5 = (args->delayRange).endLoc;
  pSVar1 = (SourceLocation *)((long)pEVar8 + lVar12 + 0x10);
  *pSVar1 = (args->delayRange).startLoc;
  pSVar1[1] = SVar5;
  *(undefined8 *)((long)pEVar8 + lVar12) = uVar3;
  ((undefined8 *)((long)pEVar8 + lVar12))[1] = uVar4;
  p = this->data_;
  sVar13 = this->len;
  lVar9 = (long)p + (sVar13 * 0x28 - (long)pos);
  pEVar10 = p;
  pEVar11 = pEVar8;
  if (lVar9 == 0) {
    pEVar10 = pEVar8;
    pEVar11 = p;
    if (sVar13 != 0) {
      do {
        (pEVar10->sequence).ptr = (pEVar11->sequence).ptr;
        uVar6 = (pEVar11->delay).min;
        _Var7 = (pEVar11->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_payload;
        uVar3 = *(undefined8 *)
                 &(pEVar11->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_engaged;
        SVar5 = (pEVar11->delayRange).endLoc;
        (pEVar10->delayRange).startLoc = (pEVar11->delayRange).startLoc;
        (pEVar10->delayRange).endLoc = SVar5;
        (pEVar10->delay).min = uVar6;
        (pEVar10->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload = _Var7;
        *(undefined8 *)
         &(pEVar10->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged = uVar3;
        pEVar11 = pEVar11 + 1;
        pEVar10 = pEVar10 + 1;
      } while (pEVar11 != pos);
    }
  }
  else {
    for (; pEVar10 != pos; pEVar10 = pEVar10 + 1) {
      (pEVar11->sequence).ptr = (pEVar10->sequence).ptr;
      uVar6 = (pEVar10->delay).min;
      _Var7 = (pEVar10->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload;
      uVar3 = *(undefined8 *)
               &(pEVar10->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged;
      SVar5 = (pEVar10->delayRange).endLoc;
      (pEVar11->delayRange).startLoc = (pEVar10->delayRange).startLoc;
      (pEVar11->delayRange).endLoc = SVar5;
      (pEVar11->delay).min = uVar6;
      (pEVar11->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload = _Var7;
      *(undefined8 *)
       &(pEVar11->delay).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = uVar3;
      pEVar11 = pEVar11 + 1;
    }
    memcpy((void *)((long)pEVar8 + lVar12 + 0x28),pos,((lVar9 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar13 = this->len;
  }
  this->len = sVar13 + 1;
  this->cap = uVar14;
  this->data_ = pEVar8;
  return (pointer)((long)pEVar8 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}